

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createTriangleSphere
          (Vec3fa *center,float radius,size_t N,Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fa *ptr;
  iterator iVar5;
  undefined8 uVar6;
  Node *pNVar7;
  int iVar8;
  TriangleMeshNode *this;
  Vec3fa *pVVar9;
  int iVar10;
  int iVar11;
  long *in_RCX;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float phif;
  uint p00;
  Triangle local_b8;
  float local_ac;
  long local_a8;
  float local_a0;
  float local_9c;
  ulong local_98;
  TriangleMeshNode *local_90;
  ulong local_88;
  int local_80;
  float local_7c;
  Ref<embree::SceneGraph::MaterialNode> *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  float local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  Node *local_38;
  
  local_9c = radius;
  local_78 = material;
  this = (TriangleMeshNode *)operator_new(0xd8);
  local_58.ptr = (MaterialNode *)*in_RCX;
  local_90 = this;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  local_38 = (Node *)center;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  uVar18 = (int)local_78 * 2;
  local_70 = (ulong)uVar18;
  pvVar4 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(((int)local_78 + 1) * uVar18);
  uVar17 = pvVar4->size_alloced;
  uVar13 = uVar17;
  if ((uVar17 < uVar12) && (uVar13 = uVar12, uVar17 != 0)) {
    while (uVar13 = uVar17, uVar13 < uVar12) {
      uVar17 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
    }
  }
  if (uVar12 < pvVar4->size_active) {
    pvVar4->size_active = uVar12;
  }
  if (pvVar4->size_alloced == uVar13) {
    pvVar4->size_active = uVar12;
  }
  else {
    ptr = pvVar4->items;
    pVVar9 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
    pvVar4->items = pVVar9;
    if (pvVar4->size_active != 0) {
      lVar16 = 0;
      uVar17 = 0;
      do {
        puVar3 = (undefined8 *)((long)&ptr->field_0 + lVar16);
        uVar6 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar16);
        *puVar2 = *puVar3;
        puVar2[1] = uVar6;
        uVar17 = uVar17 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar17 < pvVar4->size_active);
    }
    alignedFree(ptr);
    pvVar4->size_active = uVar12;
    pvVar4->size_alloced = uVar13;
  }
  uVar13 = local_70 & 0xffffffff;
  fVar20 = (float)uVar13;
  auVar22 = rcpss(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
  fVar23 = (float)((ulong)local_78 & 0xffffffff);
  local_7c = (2.0 - fVar20 * auVar22._0_4_) * auVar22._0_4_;
  auVar21._4_4_ = in_XMM2_Db;
  auVar21._0_4_ = fVar23;
  auVar21._8_4_ = in_XMM2_Dc;
  auVar21._12_4_ = in_XMM2_Dd;
  auVar22._4_4_ = in_XMM2_Db;
  auVar22._0_4_ = fVar23;
  auVar22._8_4_ = in_XMM2_Dc;
  auVar22._12_4_ = in_XMM2_Dd;
  auVar22 = rcpss(auVar21,auVar22);
  local_50 = (2.0 - fVar23 * auVar22._0_4_) * auVar22._0_4_;
  iVar14 = (int)local_70;
  local_60 = (ulong)(iVar14 - 1);
  local_90 = (TriangleMeshNode *)&local_90->triangles;
  local_4c = iVar14 * (int)local_78;
  local_68 = (ulong)(uint)-iVar14;
  local_80 = 0;
  lVar16 = 0;
  uVar12 = 0;
  uVar17 = local_70;
  local_48 = uVar13;
  local_40 = local_68;
  do {
    local_98 = uVar12;
    if ((int)uVar17 != 0) {
      local_88 = CONCAT44(local_88._4_4_,(float)uVar12 * 3.1415927 * local_50);
      uVar17 = 0;
      do {
        local_ac = ((float)(uVar17 & 0xffffffff) + (float)(uVar17 & 0xffffffff)) * 3.1415927 *
                   local_7c;
        local_a8._0_4_ = *(float *)N;
        local_a0 = sinf((float)local_88);
        local_a0 = local_a0 * local_9c;
        fVar20 = sinf(local_ac);
        uVar18 = (int)uVar17 + (int)lVar16;
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[0] =
             fVar20 * local_a0 + (float)local_a8;
        local_a8._0_4_ = *(float *)(N + 4);
        fVar20 = cosf((float)local_88);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[1] =
             fVar20 * local_9c + (float)local_a8;
        local_a8 = CONCAT44(local_a8._4_4_,*(undefined4 *)(N + 8));
        local_a0 = sinf((float)local_88);
        local_a0 = local_a0 * local_9c;
        fVar20 = cosf(local_ac);
        ((this->positions).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar18].field_0.m128[2] =
             fVar20 * local_a0 + (float)local_a8;
        uVar17 = uVar17 + 1;
      } while (uVar13 != uVar17);
    }
    uVar17 = local_70;
    local_a8 = lVar16;
    if ((int)local_98 != 0) {
      iVar14 = (int)local_70;
      if ((int)local_98 == 1) {
        if (iVar14 != 0) {
          iVar10 = 1;
          do {
            iVar8 = iVar10;
            if ((int)local_40 + iVar10 == 0) {
              iVar8 = 0;
            }
            local_b8.v1 = (uint)local_60;
            local_b8.v0 = local_b8.v1 + iVar10;
            local_b8.v2 = iVar8 + iVar14;
            iVar5._M_current =
                 (this->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->triangles).
                super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                        ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          *)local_90,iVar5,&local_b8);
            }
            else {
              (iVar5._M_current)->v2 = local_b8.v2;
              (iVar5._M_current)->v0 = local_b8.v0;
              (iVar5._M_current)->v1 = local_b8.v1;
              ppTVar1 = &(this->triangles).
                         super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
            iVar8 = (int)local_40 + iVar10;
            iVar10 = iVar10 + 1;
          } while (iVar8 != 0);
        }
      }
      else if ((int)local_98 == (uint)local_78) {
        if (iVar14 != 0) {
          iVar8 = (int)local_98 + -1;
          iVar10 = 0;
          do {
            iVar19 = iVar10 + 1;
            iVar11 = iVar19;
            if ((int)local_60 == iVar10) {
              iVar11 = 0;
            }
            local_b8.v1 = iVar10 + (int)local_68;
            local_b8.v2 = iVar11 + iVar8 * iVar14;
            local_b8.v0 = local_4c;
            iVar5._M_current =
                 (this->triangles).
                 super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->triangles).
                super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                        ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          *)local_90,iVar5,&local_b8);
            }
            else {
              (iVar5._M_current)->v2 = local_b8.v2;
              (iVar5._M_current)->v0 = local_4c;
              (iVar5._M_current)->v1 = local_b8.v1;
              ppTVar1 = &(this->triangles).
                         super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
            iVar10 = iVar19;
          } while (iVar14 != iVar19);
        }
      }
      else if (iVar14 != 0) {
        local_ac = (float)(((int)local_98 + -1) * iVar14);
        local_88 = (ulong)(uint)((int)local_98 * iVar14);
        iVar14 = 0;
        do {
          iVar8 = iVar14 + 1;
          uVar18 = (int)local_68 + iVar14;
          iVar10 = iVar8;
          if ((int)local_60 == iVar14) {
            iVar10 = 0;
          }
          local_b8.v0 = iVar14 + local_80;
          uVar15 = (int)local_88 + iVar10;
          iVar5._M_current =
               (this->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_b8.v1 = uVar18;
            local_b8.v2 = uVar15;
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_90,iVar5,&local_b8);
          }
          else {
            (iVar5._M_current)->v2 = uVar15;
            (iVar5._M_current)->v0 = local_b8.v0;
            (iVar5._M_current)->v1 = uVar18;
            ppTVar1 = &(this->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          local_b8.v0 = iVar10 + (int)local_ac;
          iVar5._M_current =
               (this->triangles).
               super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b8.v1 = uVar15;
          local_b8.v2 = uVar18;
          if (iVar5._M_current ==
              (this->triangles).
              super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)local_90,iVar5,&local_b8);
          }
          else {
            (iVar5._M_current)->v2 = uVar18;
            (iVar5._M_current)->v0 = local_b8.v0;
            (iVar5._M_current)->v1 = uVar15;
            ppTVar1 = &(this->triangles).
                       super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          uVar13 = local_48;
          uVar17 = local_70;
          iVar14 = iVar8;
        } while ((int)local_70 != iVar8);
      }
    }
    pNVar7 = local_38;
    uVar18 = (int)local_98 + 1;
    uVar12 = (ulong)uVar18;
    lVar16 = local_a8 + uVar13;
    local_68 = (ulong)(uint)((int)local_68 + (int)uVar17);
    local_80 = local_80 + (int)uVar17;
  } while (uVar18 <= (uint)local_78);
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this;
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  (*(this->super_Node).super_RefCount._vptr_RefCount[3])(this);
  return (Ref<embree::SceneGraph::Node>)pNVar7;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTriangleSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p10,p00,p11));
          mesh->triangles.push_back(TriangleMeshNode::Triangle(p01,p11,p00));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }